

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mnist-common.cpp
# Opt level: O1

bool load_from_gguf(char *fname,ggml_context *ctx_ggml,gguf_context *ctx_gguf)

{
  uint uVar1;
  int iVar2;
  FILE *__stream;
  void *__ptr;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  size_t __n;
  bool bVar12;
  
  __stream = (FILE *)ggml_fopen(fname,"rb");
  if (__stream == (FILE *)0x0) {
LAB_001044f9:
    bVar12 = false;
  }
  else {
    __ptr = malloc(0x400000);
    uVar1 = gguf_get_n_tensors(ctx_gguf);
    bVar12 = (int)uVar1 < 1;
    if (0 < (int)uVar1) {
      uVar10 = 0;
      do {
        uVar3 = gguf_get_tensor_name(ctx_gguf,uVar10);
        lVar4 = ggml_get_tensor(ctx_ggml,uVar3);
        if (lVar4 == 0) {
          bVar12 = false;
        }
        else {
          lVar5 = gguf_get_data_offset(ctx_gguf);
          lVar6 = gguf_get_tensor_offset(ctx_gguf,uVar10);
          iVar2 = fseek(__stream,lVar5 + lVar6,0);
          if (iVar2 == 0) {
            uVar7 = ggml_nbytes(lVar4);
            bVar12 = false;
            if (uVar7 != 0) {
              uVar9 = 0;
              uVar11 = uVar7;
              do {
                __n = 0x400000;
                if (uVar11 < 0x400000) {
                  __n = uVar11;
                }
                sVar8 = fread(__ptr,1,__n,__stream);
                if (sVar8 == __n) {
                  ggml_backend_tensor_set(lVar4,__ptr,uVar9,__n);
                }
                else {
                  fclose(__stream);
                  free(__ptr);
                }
                bVar12 = false;
                if (sVar8 != __n) {
                  bVar12 = true;
                  break;
                }
                uVar9 = uVar9 + 0x400000;
                uVar11 = uVar11 - 0x400000;
              } while (uVar9 < uVar7);
            }
          }
          else {
            fclose(__stream);
            free(__ptr);
            bVar12 = true;
          }
        }
        if (bVar12) goto LAB_001044f9;
        uVar10 = uVar10 + 1;
        bVar12 = (uVar1 & 0x7fffffff) <= uVar10;
      } while (uVar10 != (uVar1 & 0x7fffffff));
    }
    fclose(__stream);
    free(__ptr);
  }
  return bVar12;
}

Assistant:

bool load_from_gguf(const char * fname, struct ggml_context * ctx_ggml, struct gguf_context * ctx_gguf) {
    FILE * f = ggml_fopen(fname, "rb");
    if (!f) {
        return false;
    }

    const size_t buf_size = 4*1024*1024;
    void * buf = malloc(buf_size);

    const int n_tensors = gguf_get_n_tensors(ctx_gguf);
    for (int i = 0; i < n_tensors; i++) {
        const char * name = gguf_get_tensor_name(ctx_gguf, i);

        struct ggml_tensor * tensor = ggml_get_tensor(ctx_ggml, name);
        if (!tensor) {
            continue;
        }

        const size_t offs = gguf_get_data_offset(ctx_gguf) + gguf_get_tensor_offset(ctx_gguf, i);

        if (fseek(f, offs, SEEK_SET) != 0) {
            fclose(f);
            free(buf);
            return false;
        }

        const size_t nbytes = ggml_nbytes(tensor);
        for (size_t pos = 0; pos < nbytes; pos += buf_size) {
            const size_t nbytes_cpy = buf_size < nbytes - pos ? buf_size : nbytes - pos;

            if (fread(buf, 1, nbytes_cpy, f) != nbytes_cpy) {
                fclose(f);
                free(buf);
                return false;
            }

            ggml_backend_tensor_set(tensor, buf, pos, nbytes_cpy);
        }
    }

    fclose(f);
    free(buf);
    return true;
}